

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySet,_1UL>::Construct
                   (DB *db,LIST *params)

{
  IfcPropertySet *in;
  
  in = (IfcPropertySet *)operator_new(0xe8);
  *(undefined ***)&in->field_0xd0 = &PTR__Object_008d12a0;
  *(undefined8 *)&in->field_0xd8 = 0;
  *(char **)&in->field_0xe0 = "IfcPropertySet";
  Assimp::IFC::Schema_2x3::IfcPropertySetDefinition::IfcPropertySetDefinition
            ((IfcPropertySetDefinition *)in,&PTR_construction_vtable_24__00985088);
  *(undefined8 *)&(in->super_IfcPropertySetDefinition).field_0xb0 = 0;
  (in->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcPropertySet_00984fd0;
  *(undefined ***)&in->field_0xd0 = &PTR__IfcPropertySet_00985070;
  *(undefined ***)
   &(in->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x88 =
       &PTR__IfcPropertySet_00984ff8;
  *(undefined ***)
   &(in->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x98 =
       &PTR__IfcPropertySet_00985020;
  *(undefined ***)&(in->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.field_0xa8 =
       &PTR__IfcPropertySet_00985048;
  *(undefined8 *)&(in->super_IfcPropertySetDefinition).field_0xb8 = 0;
  *(undefined8 *)&in->field_0xc0 = 0;
  *(undefined8 *)&in->field_0xc8 = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcPropertySet>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
         (long)(in->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }